

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::PushBigChunk(ON_BinaryArchive *this,ON__UINT32 typecode,ON__INT64 big_value)

{
  ON__UINT64 OVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  ulong uStack_60;
  ON_3DM_BIG_CHUNK local_58;
  
  local_58.m_do_crc16 = '\0';
  local_58.m_do_crc32 = '\0';
  local_58.m_crc16 = 0;
  local_58.m_crc32 = 0;
  local_58._28_4_ = 0;
  local_58.m_typecode = typecode;
  if ((int)typecode < 0) {
LAB_003caeab:
    bVar6 = 0;
    bVar4 = 0;
    uStack_60 = 0;
    uVar5 = 0;
    goto LAB_003caedd;
  }
  if (typecode == 0) {
    iVar3 = this->m_3dm_version;
    if (big_value < 0 || iVar3 == 1) goto LAB_003caeab;
  }
  else {
    if (big_value < 0) goto LAB_003caeab;
    iVar3 = this->m_3dm_version;
  }
  if ((typecode >> 0x10 & 1) == 0 || iVar3 != 1) {
    if (typecode != 0x2fffd) {
      if (typecode == 0x2000013) {
        if (iVar3 == 1) goto LAB_003caec2;
      }
      else if ((short)typecode < 0 && iVar3 != 1) goto LAB_003caf5b;
      bVar4 = 0;
      uStack_60 = 0;
      goto LAB_003caed5;
    }
    if (iVar3 == 1) goto LAB_003caec2;
LAB_003caf5b:
    local_58.m_do_crc16 = '\0';
    local_58.m_do_crc32 = '\x01';
    local_58.m_crc16 = 0;
    local_58.m_crc32 = 0;
    bVar6 = 1;
    uStack_60 = 4;
    bVar4 = 0;
  }
  else {
LAB_003caec2:
    local_58.m_do_crc16 = '\x01';
    local_58.m_do_crc32 = '\0';
    local_58.m_crc16 = 1;
    local_58.m_crc32 = 0;
    uStack_60 = 2;
    bVar4 = 1;
LAB_003caed5:
    bVar6 = 0;
  }
  local_58.m_bLongChunk = 1;
  local_58._29_3_ = 0;
  uVar5 = big_value;
LAB_003caedd:
  OVar1 = this->m_current_positionX;
  local_58.m_start_offset = OVar1;
  local_58.m_end_offset = OVar1;
  local_58.m_big_value = big_value;
  bVar2 = ReadMode(this);
  if ((uStack_60 <= uVar5 && uVar5 - uStack_60 != 0) && bVar2) {
    local_58.m_end_offset = (uVar5 - uStack_60) + OVar1;
  }
  this->m_bDoChunkCRC = (bool)(bVar4 | bVar6);
  if ((this->m_chunk).m_capacity == 0) {
    ON_SimpleArray<ON_3DM_BIG_CHUNK>::Reserve(&this->m_chunk,0x80);
  }
  ON_SimpleArray<ON_3DM_BIG_CHUNK>::Append(&this->m_chunk,&local_58);
  return true;
}

Assistant:

bool ON_BinaryArchive::PushBigChunk( ON__UINT32 typecode, ON__INT64 big_value )
{
  ON_3DM_BIG_CHUNK c;
  memset(&c,0,sizeof(c));
  c.m_typecode  = typecode;
  c.m_big_value = big_value;
  ON__UINT64 length = 0;
  ON__UINT64 sizeof_crc = 0;

  // | and & are BITOPS - do NOT change to || and &&
  //
  // Some v1 files have a short chunk with typecode = 0.
  //
  // NOTE: RenderXXXX plug-in used zero as a typecode in material userdata, sigh ...
  // so ... const bool bLongChunk = (0 != typecode && 0 == (TCODE_SHORT & typecode)); doesn't work.
  //
  const bool bLongChunk = (0 == (TCODE_SHORT & typecode) && (0 != typecode || 1 != Archive3dmVersion()) && big_value >= 0 );
  if ( bLongChunk )
  {
    length = (ON__UINT64)big_value;

    if ( m_3dm_version == 1 && 0 != (TCODE_LEGACY_GEOMETRY & typecode) )
    {
      // these legacy typecodes have 16 bit CRCs
      c.m_do_crc16 = 1;
      c.m_crc16 = 1;
    }
    else 
    {
      // some other legacy typecodes that have 16 bit CRCs
      switch(typecode) 
      {

      case TCODE_SUMMARY:
        if ( m_3dm_version == 1 ) 
        {
          c.m_do_crc16 = 1;
          c.m_crc16 = 1;
        }
        break;

      case TCODE_OPENNURBS_OBJECT | TCODE_CRC | 0x7FFD:
        if ( m_3dm_version == 1 ) 
        {
          // 1.1 uuid has a 16 bit crc
          c.m_do_crc16 = 1;
          c.m_crc16 = 1;
        }
        else 
        {
          // 2.0 uuid has a 32 bit crc
          c.m_do_crc32 = 1;
          c.m_crc32 = 0;
        }
        break;

      default:
        if ( m_3dm_version != 1 && 0 != (TCODE_CRC & typecode) ) 
        {
          // 32 bit CRC
          c.m_do_crc32 = 1;
          c.m_crc32 = 0;
        }
        break;

      }
    }

    c.m_bLongChunk = 1;
    sizeof_crc = c.m_do_crc32 ? 4 : (c.m_do_crc16 ? 2 : 0);
  }

  c.m_start_offset = CurrentPosition();
  c.m_end_offset = c.m_start_offset;
  if (ReadMode() && length > sizeof_crc)
    c.m_end_offset += (length - sizeof_crc);
  m_bDoChunkCRC = c.m_do_crc16 || c.m_do_crc32;
  
  if ( m_chunk.Capacity() == 0 )
    m_chunk.Reserve(128);
  m_chunk.Append( c );

  return true;
}